

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::
       set_caster<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>,unsigned_int>
       ::
       cast<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>&>
                 (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *src,return_value_policy policy,handle parent)

{
  int iVar1;
  handle hVar2;
  _Hash_node_base *p_Var3;
  set s;
  object value_;
  handle local_20;
  handle local_18;
  
  set::set((set *)&local_20);
  p_Var3 = (src->_M_h)._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      local_18.m_ptr = (PyObject *)PyLong_FromSize_t(*(undefined4 *)&p_Var3[1]._M_nxt);
      if (local_18.m_ptr == (PyObject *)0x0) {
LAB_001da784:
        object::~object((object *)&local_18);
        hVar2.m_ptr = (PyObject *)0x0;
        goto LAB_001da790;
      }
      iVar1 = PySet_Add(local_20.m_ptr,local_18.m_ptr);
      if (iVar1 != 0) goto LAB_001da784;
      object::~object((object *)&local_18);
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  hVar2.m_ptr = local_20.m_ptr;
  local_20.m_ptr = (PyObject *)0x0;
LAB_001da790:
  object::~object((object *)&local_20);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Key>::policy(policy);
        pybind11::set s;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(key_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_ || !s.add(value_))
                return handle();
        }
        return s.release();
    }